

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_cube__init_from
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  long lVar1;
  bool bVar2;
  bool bVar3;
  uint32 uVar4;
  create_cube__init_from__AttributeData *pcVar5;
  StringHash SVar6;
  long lVar7;
  xmlChar **ppxVar8;
  bool failed;
  bool failed_1;
  bool local_39;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  pcVar5 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::create_cube__init_from__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar8 = attributes->attributes;
  if (ppxVar8 == (xmlChar **)0x0) {
LAB_0076619c:
    if ((pcVar5->face == ENUM__image_face_enum__NOT_PRESENT) &&
       (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                           0xa5a90d,0x6c795,(ParserChar *)0x0), bVar3)) {
      return false;
    }
    if (((pcVar5->present_attributes & 1) == 0) &&
       (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                           0xa5a90d,0x6603ec8,(ParserChar *)0x0), bVar3)) {
      return false;
    }
    bVar3 = true;
  }
  else {
LAB_00766052:
    do {
      while( true ) {
        text = *ppxVar8;
        if (text == (ParserChar *)0x0) goto LAB_0076619c;
        SVar6 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar8[1];
        ppxVar8 = ppxVar8 + 2;
        if (SVar6 != 0xf38d248) break;
        uVar4 = GeneratedSaxParser::Utils::toUint32(buffer,&failed_1);
        pcVar5->array_index = uVar4;
        if (failed_1 == true) {
          SVar6 = 0xf38d248;
LAB_0076617d:
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                             0xa5a90d,SVar6,buffer);
          if (bVar3) {
            return false;
          }
        }
      }
      if (SVar6 == 0x6603ec8) {
        uVar4 = GeneratedSaxParser::Utils::toUint32(buffer,&failed);
        pcVar5->mip_index = uVar4;
        if ((failed == true) &&
           (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                               0xa5a90d,0x6603ec8,buffer), bVar3)) {
          return false;
        }
        if ((failed & 1U) == 0) {
          *(byte *)&pcVar5->present_attributes = (byte)pcVar5->present_attributes | 1;
        }
        goto LAB_00766052;
      }
      if (SVar6 == 0x6c795) {
        SVar6 = GeneratedSaxParser::Utils::calculateStringHash(buffer,&local_39);
        lVar1 = 0;
        do {
          lVar7 = lVar1;
          if (lVar7 + 0x10 == 0x70) {
            local_39 = true;
            pcVar5->face = ENUM__image_face_enum__COUNT;
            SVar6 = 0x6c795;
            goto LAB_0076617d;
          }
          lVar1 = lVar7 + 0x10;
        } while (*(StringHash *)((long)&ENUM__image_face_enumMap + lVar7) != SVar6);
        pcVar5->face = *(ENUM__image_face_enum *)((long)&DAT_00868ff8 + lVar7);
        goto LAB_00766052;
      }
      bVar3 = false;
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0xa5a90d,text,
                         buffer);
    } while (!bVar2);
  }
  return bVar3;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_cube__init_from( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_cube__init_from( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_cube__init_from__AttributeData* attributeData = newData<create_cube__init_from__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_FACE:
    {
bool failed;
attributeData->face = Utils::toEnum<ENUM__image_face_enum, StringHash, ENUM__image_face_enum__COUNT>(attributeValue, failed, ENUM__image_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INIT_FROM,
        HASH_ATTRIBUTE_FACE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_MIP_INDEX:
    {
bool failed;
attributeData->mip_index = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INIT_FROM,
        HASH_ATTRIBUTE_MIP_INDEX,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= create_cube__init_from__AttributeData::ATTRIBUTE_MIP_INDEX_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_ARRAY_INDEX:
    {
bool failed;
attributeData->array_index = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INIT_FROM,
        HASH_ATTRIBUTE_ARRAY_INDEX,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INIT_FROM, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->face == ENUM__image_face_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INIT_FROM, HASH_ATTRIBUTE_FACE, 0 ) )
        return false;
}
if ( (attributeData->present_attributes & create_cube__init_from__AttributeData::ATTRIBUTE_MIP_INDEX_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INIT_FROM, HASH_ATTRIBUTE_MIP_INDEX, 0 ) )
        return false;
}


    return true;
}